

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O3

Cnf_Cut_t * Cnf_CutCompose(Cnf_Man_t *p,Cnf_Cut_t *pCut,Cnf_Cut_t *pCutFan,int iFan)

{
  Cnf_Cut_t *__dest;
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  uint *puVar9;
  uint *pOut;
  Vec_Int_t *pVVar10;
  bool bVar11;
  int iVar12;
  Cnf_Cut_t *pCVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int i;
  int *piVar22;
  int k;
  long lVar23;
  short sVar24;
  uint uPhase;
  uint Phase;
  size_t sVar25;
  
  if (0 < (long)pCut->nFanins) {
    puVar8 = p->pTruths[0];
    puVar9 = p->pTruths[2];
    pOut = p->pTruths[3];
    lVar23 = 0;
    do {
      if (*(int *)((long)pCut[1].vIsop + lVar23 * 4 + -8) == iFan) {
        uVar15 = (uint)lVar23;
        Cnf_CutRemoveIthVar(pCut,uVar15,iFan);
        cVar1 = pCut->nFanins;
        iVar12 = (int)cVar1;
        if (0 < iVar12) {
          cVar2 = pCutFan->nFanins;
          uVar18 = 0;
          piVar22 = Cnf_CutCompose::pFanins;
          iVar17 = 0;
          iVar20 = 0;
          goto LAB_005052b0;
        }
        iVar20 = 0;
        iVar17 = 0;
        uVar18 = 0;
        goto LAB_005052f6;
      }
      lVar23 = lVar23 + 1;
    } while (pCut->nFanins != lVar23);
  }
  __assert_fail("iVar < pCut->nFanins",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                ,0x133,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
LAB_005052b0:
  do {
    if (cVar2 <= iVar17) break;
    iVar6 = *(int *)((long)pCut[1].vIsop + (long)iVar20 * 4 + -8);
    iVar7 = *(int *)((long)pCutFan[1].vIsop + (long)iVar17 * 4 + -8);
    if (iVar6 == iVar7) {
      *piVar22 = iVar6;
      iVar20 = iVar20 + 1;
LAB_005052dc:
      iVar17 = iVar17 + 1;
    }
    else {
      if (iVar7 <= iVar6) {
        *piVar22 = iVar7;
        goto LAB_005052dc;
      }
      *piVar22 = iVar6;
      iVar20 = iVar20 + 1;
    }
    uVar18 = uVar18 + 1;
    piVar22 = piVar22 + 1;
  } while (iVar20 < iVar12);
LAB_005052f6:
  lVar19 = (long)iVar12;
  if (iVar20 < iVar12) {
    lVar21 = 0;
    do {
      Cnf_CutCompose::pFanins[lVar21 + (ulong)uVar18] =
           *(int *)((long)pCut[1].vIsop + lVar21 * 4 + (long)iVar20 * 4 + -8);
      lVar21 = lVar21 + 1;
    } while (lVar19 - iVar20 != lVar21);
    uVar18 = uVar18 + (int)lVar21;
  }
  cVar2 = pCutFan->nFanins;
  if (iVar17 < cVar2) {
    lVar21 = 0;
    do {
      Cnf_CutCompose::pFanins[lVar21 + (ulong)uVar18] =
           *(int *)((long)pCutFan[1].vIsop + lVar21 * 4 + (long)iVar17 * 4 + -8);
      lVar21 = lVar21 + 1;
    } while ((long)(int)cVar2 - (long)iVar17 != lVar21);
    uVar18 = uVar18 + (int)lVar21;
  }
  if ((int)uVar18 < p->nMergeLimit) {
    cVar1 = (char)uVar18;
    iVar12 = 1 << (cVar1 - 5U & 0x1f);
    if ((int)uVar18 < 6) {
      iVar12 = 1;
    }
    pCVar13 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,(iVar12 + uVar18) * 4 + 0x18);
    pCVar13->nFanins = cVar1;
    sVar24 = (short)iVar12;
    pCVar13->nWords = sVar24;
    pCVar13->vIsop[0] = (Vec_Int_t *)0x0;
    pCVar13->vIsop[1] = (Vec_Int_t *)0x0;
    __dest = pCVar13 + 1;
    memcpy(__dest,Cnf_CutCompose::pFanins,(long)(int)uVar18 << 2);
    cVar2 = pCut->nFanins;
    cVar3 = pCutFan->nFanins;
    if ((int)cVar3 + (int)cVar2 < (int)cVar1) {
      __assert_fail("pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                    ,0x140,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
    }
    if (0 < sVar24) {
      sVar5 = pCut->nWords;
      uVar16 = 0;
      do {
        puVar8[uVar16] =
             *(uint *)((long)pCut[1].vIsop +
                      ((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) %
                       (long)(int)sVar5 & 0xffffffffU) * 4 + (long)(int)cVar2 * 4 + -8);
        uVar16 = uVar16 + 1;
      } while ((uint)(iVar12 << 0x10) >> 0xf != uVar16);
      if (0 < sVar24) {
        sVar5 = pCutFan->nWords;
        uVar16 = 0;
        do {
          puVar9[uVar16] =
               *(uint *)((long)pCutFan[1].vIsop +
                        ((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) %
                         (long)(int)sVar5 & 0xffffffffU) * 4 + (long)(int)cVar3 * 4 + -8);
          uVar16 = uVar16 + 1;
        } while ((uint)(int)sVar24 != uVar16);
      }
    }
    if ('\x1f' < cVar1) {
      __assert_fail("nBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                    ,0xe4,"unsigned int Kit_BitMask(int)");
    }
    iVar12 = cVar1 + 1;
    Kit_TruthShrink(pOut,puVar8,(int)cVar1,iVar12,
                    ~(-1 << ((byte)iVar12 & 0x1f) | 1 << (uVar15 & 0x1f)),1);
    bVar4 = pCVar13->nFanins;
    uVar15 = (uint)(char)bVar4;
    if ((char)bVar4 < '\x01') {
      uVar18 = 1 << (bVar4 & 0x1f);
      iVar12 = (int)pCut->nFanins;
      Phase = 0;
    }
    else {
      iVar12 = (int)pCut->nFanins;
      lVar19 = 0;
      iVar17 = 0;
      uVar18 = 0;
      do {
        if (iVar17 == iVar12) break;
        iVar20 = *(int *)((long)pCut[1].vIsop + (long)iVar17 * 4 + -8);
        iVar6 = *(int *)((long)__dest->vIsop + lVar19 * 4 + -8);
        if (iVar20 <= iVar6) {
          if (iVar6 != iVar20) goto LAB_00505807;
          uVar18 = uVar18 | 1 << ((uint)lVar19 & 0x1f);
          iVar17 = iVar17 + 1;
        }
        lVar19 = lVar19 + 1;
      } while ((int)uVar15 != lVar19);
      uVar18 = uVar18 | 1 << (uVar15 & 0x1f);
      lVar19 = 0;
      iVar17 = 0;
      Phase = 0;
      do {
        if (iVar17 == pCutFan->nFanins) break;
        iVar20 = *(int *)((long)pCutFan[1].vIsop + (long)iVar17 * 4 + -8);
        iVar6 = *(int *)((long)__dest->vIsop + lVar19 * 4 + -8);
        if (iVar20 <= iVar6) {
          if (iVar6 != iVar20) {
LAB_00505807:
            __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                          ,0xec,"unsigned int Cnf_TruthPhase(Cnf_Cut_t *, Cnf_Cut_t *)");
          }
          Phase = Phase | 1 << ((uint)lVar19 & 0x1f);
          iVar17 = iVar17 + 1;
        }
        lVar19 = lVar19 + 1;
      } while ((int)uVar15 != lVar19);
    }
    Kit_TruthStretch(pOut,puVar8,iVar12 + 1,uVar15 + 1,uVar18,1);
    Kit_TruthStretch(pOut,puVar9,(int)pCutFan->nFanins,(int)pCVar13->nFanins,Phase,1);
    uVar15 = 1 << (pCVar13->nFanins - 5U & 0x1f);
    if (pCVar13->nFanins < '\x06') {
      uVar15 = 1;
    }
    lVar19 = (long)cVar1 * 4 + 0x14;
    if (0 < (int)uVar15) {
      sVar24 = pCVar13->nWords;
      uVar16 = (ulong)uVar15;
      do {
        *(uint *)((long)pCVar13->vIsop + uVar16 * 4 + lVar19 + -8) =
             (puVar8[(long)sVar24 + (uVar16 - 1)] ^ puVar8[uVar16 - 1]) & puVar9[uVar16 - 1] ^
             puVar8[uVar16 - 1];
        bVar11 = 1 < uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar11);
    }
    cVar2 = pCut->nFanins;
    for (lVar21 = (long)cVar2; lVar23 < lVar21; lVar21 = lVar21 + -1) {
      *(undefined4 *)((long)pCut[1].vIsop + lVar21 * 4 + -8) =
           *(undefined4 *)((long)pCut->vIsop + lVar21 * 4 + 0xc);
    }
    puVar8 = (uint *)((long)__dest->vIsop + (long)cVar1 * 4 + -8);
    *(int *)((long)pCut[1].vIsop + lVar23 * 4 + -8) = iFan;
    pCut->nFanins = cVar2 + '\x01';
    if (pCVar13->nFanins < 5) {
      pCVar13->Cost = p->pSopSizes[(ulong)(ushort)*puVar8 ^ 0xffff] + p->pSopSizes[(ushort)*puVar8];
    }
    else {
      pVVar14 = (Vec_Int_t *)0x0;
      iVar12 = Kit_TruthIsop(puVar8,(int)pCVar13->nFanins,p->vMemory,0);
      if (iVar12 != -1) {
        pVVar10 = p->vMemory;
        pVVar14 = (Vec_Int_t *)malloc(0x10);
        iVar12 = pVVar10->nSize;
        pVVar14->nSize = iVar12;
        pVVar14->nCap = iVar12;
        if ((long)iVar12 == 0) {
          sVar25 = 0;
          piVar22 = (int *)0x0;
        }
        else {
          sVar25 = (long)iVar12 << 2;
          piVar22 = (int *)malloc(sVar25);
        }
        pVVar14->pArray = piVar22;
        memcpy(piVar22,pVVar10->pArray,sVar25);
      }
      pCVar13->vIsop[1] = pVVar14;
      cVar1 = pCVar13->nFanins;
      uVar15 = 1 << (cVar1 - 5U & 0x1f);
      if (cVar1 < 6) {
        uVar15 = 1;
      }
      if (0 < (int)uVar15) {
        uVar16 = (ulong)uVar15;
        do {
          puVar9 = (uint *)((long)pCVar13->vIsop + uVar16 * 4 + lVar19 + -8);
          *puVar9 = ~*puVar9;
          bVar11 = 1 < uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar11);
      }
      pVVar14 = (Vec_Int_t *)0x0;
      iVar12 = Kit_TruthIsop(puVar8,(int)cVar1,p->vMemory,0);
      if (iVar12 != -1) {
        pVVar10 = p->vMemory;
        pVVar14 = (Vec_Int_t *)malloc(0x10);
        iVar12 = pVVar10->nSize;
        pVVar14->nSize = iVar12;
        pVVar14->nCap = iVar12;
        if ((long)iVar12 == 0) {
          sVar25 = 0;
          piVar22 = (int *)0x0;
        }
        else {
          sVar25 = (long)iVar12 << 2;
          piVar22 = (int *)malloc(sVar25);
        }
        pVVar14->pArray = piVar22;
        memcpy(piVar22,pVVar10->pArray,sVar25);
      }
      pCVar13->vIsop[0] = pVVar14;
      uVar15 = 1 << (pCVar13->nFanins - 5U & 0x1f);
      if (pCVar13->nFanins < '\x06') {
        uVar15 = 1;
      }
      if (0 < (int)uVar15) {
        uVar16 = (ulong)uVar15;
        do {
          puVar8 = (uint *)((long)pCVar13->vIsop + uVar16 * 4 + lVar19 + -8);
          *puVar8 = ~*puVar8;
          bVar11 = 1 < uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar11);
      }
      if (((pVVar14 == (Vec_Int_t *)0x0) || (pCVar13->vIsop[1] == (Vec_Int_t *)0x0)) ||
         (iVar12 = pCVar13->vIsop[1]->nSize + pVVar14->nSize, 0x7f < iVar12)) {
        pCVar13->Cost = '\x7f';
      }
      else {
        pCVar13->Cost = (char)iVar12;
      }
    }
  }
  else {
    if ((int)uVar15 < iVar12) {
      do {
        *(undefined4 *)((long)pCut[1].vIsop + lVar19 * 4 + -8) =
             *(undefined4 *)((long)pCut->vIsop + lVar19 * 4 + 0xc);
        lVar19 = lVar19 + -1;
      } while (lVar23 < lVar19);
    }
    *(int *)((long)pCut[1].vIsop + lVar23 * 4 + -8) = iFan;
    pCut->nFanins = cVar1 + '\x01';
    pCVar13 = (Cnf_Cut_t *)0x0;
  }
  return pCVar13;
}

Assistant:

Cnf_Cut_t * Cnf_CutCompose( Cnf_Man_t * p, Cnf_Cut_t * pCut, Cnf_Cut_t * pCutFan, int iFan )
{
    Cnf_Cut_t * pCutRes;
    static int pFanins[32];
    unsigned * pTruth, * pTruthFan, * pTruthRes;
    unsigned * pTop = p->pTruths[0], * pFan = p->pTruths[2], * pTemp = p->pTruths[3];
    unsigned uPhase, uPhaseFan;
    int i, iVar, nFanins, RetValue;

    // make sure the second cut is the fanin of the first
    for ( iVar = 0; iVar < pCut->nFanins; iVar++ )
        if ( pCut->pFanins[iVar] == iFan )
            break;
    assert( iVar < pCut->nFanins );
    // remove this variable
    Cnf_CutRemoveIthVar( pCut, iVar, iFan );
    // merge leaves of the cuts
    nFanins = Cnf_CutMergeLeaves( pCut, pCutFan, pFanins );
    if ( nFanins+1 > p->nMergeLimit )
    {
        Cnf_CutInsertIthVar( pCut, iVar, iFan );
        return NULL;
    }
    // create new cut
    pCutRes = Cnf_CutAlloc( p, nFanins );
    memcpy( pCutRes->pFanins, pFanins, sizeof(int) * nFanins );
    assert( pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins );

    // derive its truth table
    // get the truth tables in the composition space
    pTruth    = Cnf_CutTruth(pCut);
    pTruthFan = Cnf_CutTruth(pCutFan);
    pTruthRes = Cnf_CutTruth(pCutRes);
    for ( i = 0; i < 2*pCutRes->nWords; i++ )
        pTop[i] = pTruth[i % pCut->nWords];
    for ( i = 0; i < pCutRes->nWords; i++ )
        pFan[i] = pTruthFan[i % pCutFan->nWords];
    // move the variable to the end
    uPhase = Kit_BitMask( pCutRes->nFanins+1 ) & ~(1 << iVar);
    Kit_TruthShrink( pTemp, pTop, pCutRes->nFanins, pCutRes->nFanins+1, uPhase, 1 );
    // compute the phases
    uPhase    = Cnf_TruthPhase( pCutRes, pCut    ) | (1 << pCutRes->nFanins);
    uPhaseFan = Cnf_TruthPhase( pCutRes, pCutFan );
    // permute truth-tables to the common support
    Kit_TruthStretch( pTemp, pTop, pCut->nFanins+1,  pCutRes->nFanins+1, uPhase,    1 );
    Kit_TruthStretch( pTemp, pFan, pCutFan->nFanins, pCutRes->nFanins,   uPhaseFan, 1 );
    // perform Boolean operation
    Kit_TruthMux( pTruthRes, pTop, pTop+pCutRes->nWords, pFan, pCutRes->nFanins );
    // return the cut to its original condition
    Cnf_CutInsertIthVar( pCut, iVar, iFan );
    // consider the simple case
    if ( pCutRes->nFanins < 5 )
    {
        pCutRes->Cost = p->pSopSizes[0xFFFF & *pTruthRes] + p->pSopSizes[0xFFFF & ~*pTruthRes];
        return pCutRes;
    }

    // derive ISOP for positive phase
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[1] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    // derive ISOP for negative phase
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[0] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );

    // compute the cut cost
    if ( pCutRes->vIsop[0] == NULL || pCutRes->vIsop[1] == NULL )
        pCutRes->Cost = 127;
    else if ( Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]) > 127 )
        pCutRes->Cost = 127;
    else
        pCutRes->Cost = Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]);
    return pCutRes;
}